

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_bbdpre.c
# Opt level: O2

int IDABBDPrecSetup(sunrealtype tt,N_Vector yy,N_Vector yp,N_Vector rr,sunrealtype c_j,
                   void *bbd_data)

{
  double dVar1;
  IDAMem IDA_mem;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  sunrealtype *psVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long j;
  ulong uVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  long local_b0;
  long local_90;
  
  IDA_mem = *(IDAMem *)((long)bbd_data + 0x98);
  SUNMatZero(*(undefined8 *)((long)bbd_data + 0x40));
  uVar2 = *(undefined8 *)((long)bbd_data + 0x60);
  uVar3 = *(undefined8 *)((long)bbd_data + 0x68);
  uVar4 = *(undefined8 *)((long)bbd_data + 0x70);
  uVar5 = *(undefined8 *)((long)bbd_data + 0x78);
  lVar6 = *(long *)((long)bbd_data + 0x98);
  N_VScale(0x3ff0000000000000,yy);
  N_VScale(0x3ff0000000000000,yp,uVar4);
  lVar10 = N_VGetArrayPointer(yy);
  lVar11 = N_VGetArrayPointer(yp);
  lVar12 = N_VGetArrayPointer(uVar5);
  lVar13 = N_VGetArrayPointer(*(undefined8 *)(lVar6 + 0x180));
  if (*(int *)(lVar6 + 0x58) == 0) {
    local_b0 = 0;
  }
  else {
    local_b0 = N_VGetArrayPointer(*(undefined8 *)(lVar6 + 0x1b8));
  }
  lVar14 = N_VGetArrayPointer(uVar3);
  lVar15 = N_VGetArrayPointer(uVar4);
  lVar16 = N_VGetArrayPointer(uVar2);
  if ((*(code **)((long)bbd_data + 0x30) == (code *)0x0) ||
     (iVar9 = (**(code **)((long)bbd_data + 0x30))
                        (tt,*(undefined8 *)((long)bbd_data + 0x38),yy,yp,
                         *(undefined8 *)(lVar6 + 0x18)), iVar9 == 0)) {
    iVar9 = (**(code **)((long)bbd_data + 0x28))
                      (tt,*(undefined8 *)((long)bbd_data + 0x38),yy,yp,uVar2,
                       *(undefined8 *)(lVar6 + 0x18));
    *(long *)((long)bbd_data + 0x90) = *(long *)((long)bbd_data + 0x90) + 1;
    if (iVar9 == 0) {
      lVar7 = *bbd_data;
      lVar8 = *(long *)((long)bbd_data + 8);
      lVar20 = lVar8 + lVar7 + 1;
      lVar24 = *(long *)((long)bbd_data + 0x38);
      lVar23 = lVar24;
      if (lVar20 < lVar24) {
        lVar23 = lVar20;
      }
      if (lVar23 < 1) {
        lVar23 = 0;
      }
      lVar22 = 1;
      local_90 = 0;
      do {
        if (lVar22 == lVar23 + 1) {
          iVar9 = SUNLinSolSetup_Band(*(SUNLinearSolver *)((long)bbd_data + 0x48),
                                      *(SUNMatrix *)((long)bbd_data + 0x40));
          return iVar9;
        }
        j = lVar22 + -1;
        for (lVar17 = j; lVar17 < lVar24; lVar17 = lVar17 + lVar20) {
          dVar1 = *(double *)(lVar10 + lVar17 * 8);
          dVar26 = *(double *)(lVar11 + lVar17 * 8) * *(double *)(lVar6 + 0x290);
          dVar27 = ABS(dVar26);
          dVar28 = 1.0 / *(double *)(lVar13 + lVar17 * 8);
          if (dVar27 <= dVar28) {
            dVar27 = dVar28;
          }
          dVar28 = ABS(dVar1);
          if (ABS(dVar1) <= dVar27) {
            dVar28 = dVar27;
          }
          dVar28 = dVar28 * *(double *)((long)bbd_data + 0x20);
          uVar25 = -(ulong)(dVar26 < 0.0);
          dVar27 = ((double)((ulong)-dVar28 & uVar25 | ~uVar25 & (ulong)dVar28) + dVar1) - dVar1;
          if (*(int *)(lVar6 + 0x58) != 0) {
            dVar26 = *(double *)(local_b0 + lVar17 * 8);
            dVar28 = ABS(dVar26);
            if ((dVar28 != 1.0) || (NAN(dVar28))) {
              if ((dVar28 == 2.0) && ((!NAN(dVar28) && ((dVar1 + dVar27) * dVar26 <= 0.0))))
              goto LAB_0010ece9;
            }
            else if ((dVar1 + dVar27) * dVar26 < 0.0) {
LAB_0010ece9:
              dVar27 = -dVar27;
            }
          }
          *(double *)(lVar14 + lVar17 * 8) = dVar27 + *(double *)(lVar14 + lVar17 * 8);
          *(double *)(lVar15 + lVar17 * 8) = c_j * dVar27 + *(double *)(lVar15 + lVar17 * 8);
        }
        iVar9 = (**(code **)((long)bbd_data + 0x28))
                          (lVar24,uVar3,uVar4,uVar5,*(undefined8 *)(lVar6 + 0x18));
        *(long *)((long)bbd_data + 0x90) = *(long *)((long)bbd_data + 0x90) + 1;
        if (iVar9 != 0) break;
        lVar24 = *(long *)((long)bbd_data + 0x38);
        lVar17 = local_90;
        for (; j < lVar24; j = j + lVar20) {
          dVar1 = *(double *)(lVar10 + j * 8);
          *(double *)(lVar14 + j * 8) = dVar1;
          dVar27 = *(double *)(lVar11 + j * 8);
          *(double *)(lVar15 + j * 8) = dVar27;
          dVar27 = dVar27 * *(double *)(lVar6 + 0x290);
          dVar26 = ABS(dVar27);
          dVar28 = 1.0 / *(double *)(lVar13 + j * 8);
          if (dVar26 <= dVar28) {
            dVar26 = dVar28;
          }
          dVar28 = ABS(dVar1);
          if (ABS(dVar1) <= dVar26) {
            dVar28 = dVar26;
          }
          dVar28 = dVar28 * *(double *)((long)bbd_data + 0x20);
          uVar25 = -(ulong)(dVar27 < 0.0);
          dVar27 = ((double)((ulong)-dVar28 & uVar25 | ~uVar25 & (ulong)dVar28) + dVar1) - dVar1;
          if (*(int *)(lVar6 + 0x58) != 0) {
            dVar26 = *(double *)(local_b0 + j * 8);
            dVar28 = ABS(dVar26);
            if ((dVar28 != 1.0) || (NAN(dVar28))) {
              if ((dVar28 == 2.0) && ((!NAN(dVar28) && ((dVar1 + dVar27) * dVar26 <= 0.0))))
              goto LAB_0010ee5a;
            }
            else if ((dVar1 + dVar27) * dVar26 < 0.0) {
LAB_0010ee5a:
              dVar27 = -dVar27;
            }
          }
          psVar18 = SUNBandMatrix_Column(*(SUNMatrix *)((long)bbd_data + 0x40),j);
          lVar19 = j - *(long *)((long)bbd_data + 0x10);
          if (lVar19 < 1) {
            lVar19 = 0;
          }
          lVar21 = *(long *)((long)bbd_data + 0x18) + j;
          lVar24 = *(long *)((long)bbd_data + 0x38);
          if (lVar24 + -1 <= lVar21) {
            lVar21 = lVar24 + -1;
          }
          for (; lVar19 <= lVar21; lVar19 = lVar19 + 1) {
            *(double *)((long)psVar18 + lVar19 * 8 + lVar17) =
                 (*(double *)(lVar12 + lVar19 * 8) - *(double *)(lVar16 + lVar19 * 8)) *
                 (1.0 / dVar27);
          }
          lVar17 = lVar17 + ~(lVar8 + lVar7) * 8;
        }
        lVar22 = lVar22 + 1;
        local_90 = local_90 + -8;
      } while( true );
    }
  }
  if (iVar9 < 0) {
    iVar9 = -1;
    IDAProcessError(IDA_mem,-1,0x1db,"IDABBDPrecSetup",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_bbdpre.c"
                    ,"The Glocal or Gcomm routine failed in an unrecoverable manner.");
  }
  else {
    iVar9 = 1;
  }
  return iVar9;
}

Assistant:

static int IDABBDPrecSetup(sunrealtype tt, N_Vector yy, N_Vector yp,
                           SUNDIALS_MAYBE_UNUSED N_Vector rr, sunrealtype c_j,
                           void* bbd_data)
{
  IBBDPrecData pdata;
  IDAMem IDA_mem;
  int retval;

  pdata = (IBBDPrecData)bbd_data;

  IDA_mem = (IDAMem)pdata->ida_mem;

  /* Call IBBDDQJac for a new Jacobian calculation and store in PP. */
  retval = SUNMatZero(pdata->PP);
  retval = IBBDDQJac(pdata, tt, c_j, yy, yp, pdata->tempv1, pdata->tempv2,
                     pdata->tempv3, pdata->tempv4);
  if (retval < 0)
  {
    IDAProcessError(IDA_mem, -1, __LINE__, __func__, __FILE__,
                    MSGBBD_FUNC_FAILED);
    return (-1);
  }
  if (retval > 0) { return (1); }

  /* Do LU factorization of matrix and return error flag */
  retval = SUNLinSolSetup_Band(pdata->LS, pdata->PP);
  return (retval);
}